

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

size_t searchCodeIndex(uint *array,size_t array_size,size_t value)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = array_size - 1;
  uVar3 = 1;
  while (uVar3 <= uVar2) {
    uVar1 = uVar3 + uVar2 >> 1;
    if (array[uVar1] < value) {
      uVar3 = uVar1 + 1;
    }
    else {
      uVar2 = uVar1 - 1;
    }
  }
  if ((array_size <= uVar3) || (value < array[uVar3])) {
    uVar3 = uVar3 - 1;
  }
  return uVar3;
}

Assistant:

static size_t searchCodeIndex(const unsigned* array, size_t array_size, size_t value) {
  /*binary search (only small gain over linear). TODO: use CPU log2 instruction for getting symbols instead*/
  size_t left = 1;
  size_t right = array_size - 1;

  while(left <= right) {
    size_t mid = (left + right) >> 1;
    if(array[mid] >= value) right = mid - 1;
    else left = mid + 1;
  }
  if(left >= array_size || array[left] > value) left--;
  return left;
}